

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::wheelEvent(DateTimePicker *this,QWheelEvent *event)

{
  int iVar1;
  long lVar2;
  int iVar3;
  reference pSVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  DateTimePickerPrivate *pDVar9;
  double dVar10;
  
  lVar8 = *(long *)(event + 0x58);
  if (lVar8 != 0) {
    pDVar9 = (this->d).d;
    dVar10 = (double)QEventPoint::position();
    lVar2 = (pDVar9->super_DateTimeParser).sections.d.size;
    iVar3 = -1;
    if (0 < lVar2) {
      piVar5 = &((pDVar9->super_DateTimeParser).sections.d.ptr)->sectionWidth;
      lVar6 = 0;
      iVar7 = 0;
      do {
        iVar1 = *piVar5;
        if ((iVar7 <= (int)dVar10) && ((int)dVar10 < iVar1 + iVar7)) {
          iVar3 = (int)lVar6;
          break;
        }
        lVar6 = lVar6 + 1;
        piVar5 = piVar5 + 0xc;
        iVar7 = iVar1 + iVar7;
      } while (lVar2 != lVar6);
    }
    pDVar9->movableSection = iVar3;
    if ((int)((ulong)lVar8 >> 0x20) < 1) {
      if (-1 < lVar8) goto LAB_0016567f;
      pDVar9 = (this->d).d;
      if ((long)pDVar9->movableSection != -1) {
        iVar3 = pDVar9->itemTopMargin;
        iVar7 = pDVar9->itemHeight;
        pSVar4 = QList<QtMWidgets::Section>::operator[]
                           (&(pDVar9->super_DateTimeParser).sections,(long)pDVar9->movableSection);
        pSVar4->offset = pSVar4->offset - (iVar3 + iVar7);
      }
    }
    else {
      pDVar9 = (this->d).d;
      if ((long)pDVar9->movableSection != -1) {
        iVar3 = pDVar9->itemTopMargin;
        iVar7 = pDVar9->itemHeight;
        pSVar4 = QList<QtMWidgets::Section>::operator[]
                           (&(pDVar9->super_DateTimeParser).sections,(long)pDVar9->movableSection);
        pSVar4->offset = pSVar4->offset + iVar3 + iVar7;
      }
    }
    pDVar9 = (this->d).d;
    if (0 < (pDVar9->super_DateTimeParser).sections.d.size) {
      lVar8 = 0;
      do {
        DateTimePickerPrivate::normalizeOffset(pDVar9,(int)lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pDVar9->super_DateTimeParser).sections.d.size);
      pDVar9 = (this->d).d;
    }
    if ((long)pDVar9->movableSection != -1) {
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(pDVar9->super_DateTimeParser).sections,(long)pDVar9->movableSection);
      pSVar4->offset = 0;
      pDVar9 = (this->d).d;
    }
    DateTimePickerPrivate::updateDaysIfNeeded(pDVar9);
    DateTimePickerPrivate::updateCurrentDateTime((this->d).d);
    ((this->d).d)->movableSection = -1;
    QWidget::update();
  }
LAB_0016567f:
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
DateTimePicker::wheelEvent( QWheelEvent * event )
{
	QPoint numDegrees = event->angleDelta();

	if( !numDegrees.isNull() )
	{
		d->findMovableSection( event->position() );

		if( numDegrees.y() > 0 )
			d->updateOffset( d->itemHeight + d->itemTopMargin );
		else if( numDegrees.y() < 0 )
			d->updateOffset( -( d->itemHeight + d->itemTopMargin ) );

		if( numDegrees.y() != 0 )
		{
			d->normalizeOffsets();
			d->clearOffset();
			d->updateDaysIfNeeded();
			d->updateCurrentDateTime();

			d->movableSection = -1;

			update();
		}
	}

	event->accept();
}